

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::prepareDataForColorFloatTexture
               (Functions *gl,GLint cube_face,GLint element_index,GLint mipmap_level,
               GLint n_elements,GLint n_mipmap_levels,GLenum texture_format,GLenum texture_type,
               GLsizei texture_width,GLsizei texture_height)

{
  GLfloat local_38 [2];
  GLfloat components [4];
  GLint n_mipmap_levels_local;
  GLint n_elements_local;
  GLint mipmap_level_local;
  GLint element_index_local;
  GLint cube_face_local;
  Functions *gl_local;
  
  components[3] = (GLfloat)n_mipmap_levels;
  getColorFloatComponents(cube_face,element_index,mipmap_level,n_elements,n_mipmap_levels,local_38);
  prepareDataForTexture<float,4u>
            (gl,cube_face,element_index,mipmap_level,texture_format,texture_type,texture_width,
             texture_height,local_38);
  return;
}

Assistant:

void prepareDataForColorFloatTexture(const glw::Functions& gl, glw::GLint cube_face, glw::GLint element_index,
									 glw::GLint mipmap_level, glw::GLint n_elements, glw::GLint n_mipmap_levels,
									 glw::GLenum texture_format, glw::GLenum texture_type, glw::GLsizei texture_width,
									 glw::GLsizei texture_height)
{
	glw::GLfloat components[4];

	getColorFloatComponents(cube_face, element_index, mipmap_level, n_elements, n_mipmap_levels, components);

	prepareDataForTexture<glw::GLfloat, 4>(gl, cube_face, element_index, mipmap_level, texture_format, texture_type,
										   texture_width, texture_height, components);
}